

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

void __thiscall
kws::Parser::FindPrivateArea(Parser *this,size_t *before,size_t *after,size_t startPos)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer buffer;
  size_t sVar3;
  long lVar4;
  undefined8 in_RCX;
  Parser *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  string *in_stack_00000018;
  size_t in_stack_00000020;
  Parser *in_stack_00000028;
  size_t end;
  size_t posBrace;
  size_t classpos;
  size_t eoc;
  size_t protect;
  size_t priv;
  size_t pub;
  allocator local_b1;
  size_t in_stack_ffffffffffffff50;
  Parser *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  Parser *in_stack_ffffffffffffff88;
  allocator local_69;
  string local_68 [32];
  size_t local_48;
  pointer local_40;
  undefined1 noComment;
  undefined2 uVar5;
  
  uVar5 = (undefined2)((ulong)in_RCX >> 0x30);
  *in_RSI = 0;
  (in_RDX->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar1 = (pointer)FindArea(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78);
  pEVar2 = (pointer)FindArea(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78);
  buffer = (pointer)FindArea(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78);
  if (pEVar2 == (pointer)0xffffffffffffffff) {
    pEVar2 = (pointer)0x5f5e0ff;
  }
  if (pEVar1 == (pointer)0xffffffffffffffff) {
    pEVar1 = (pointer)0x5f5e0ff;
  }
  if (buffer == (pointer)0xffffffffffffffff) {
    buffer = (pointer)0x5f5e0ff;
  }
  if ((pEVar1 < pEVar2) || (buffer < pEVar2)) {
    if ((pEVar2 < pEVar1) || (buffer < pEVar2)) {
      if ((pEVar1 < pEVar2) || (pEVar2 < buffer)) {
        *in_RSI = pEVar2;
        local_40 = (pointer)FindEndOfClass(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if (local_40 == (pointer)0xffffffffffffffff) {
          (in_RDX->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start = pEVar2;
        }
        else {
          (in_RDX->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start = local_40;
        }
      }
      else {
        *in_RSI = pEVar2;
        (in_RDX->m_ErrorList).
        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
        super__Vector_impl_data._M_start = pEVar1;
      }
    }
    else {
      *in_RSI = pEVar2;
      (in_RDX->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_start = buffer;
    }
  }
  else {
    *in_RSI = pEVar2;
    if (pEVar1 < buffer) {
      (in_RDX->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_start = pEVar1;
    }
    else {
      (in_RDX->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_start = buffer;
    }
  }
  noComment = (undefined1)((ulong)pEVar2 >> 0x38);
  if ((in_RDX->m_ErrorList).super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x5f5e0ff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    sVar3 = GetClassPosition(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if ((sVar3 != 0xffffffffffffffff) &&
       (local_48 = sVar3, lVar4 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1d7c9a),
       lVar4 != -1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff50,"",&local_b1);
      pEVar1 = (pointer)FindClosingChar(in_RDX,(char)((ushort)uVar5 >> 8),(char)uVar5,(size_t)pEVar1
                                        ,(bool)noComment,(string *)buffer);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (pEVar1 != (pointer)0xffffffffffffffff) {
        (in_RDX->m_ErrorList).
        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
        super__Vector_impl_data._M_start = pEVar1;
      }
    }
  }
  return;
}

Assistant:

void Parser::FindPrivateArea(size_t &before, size_t &after, size_t startPos) const
{
  before = 0;
  after = 0;

  // First look if public is before protected and private
  size_t pub = this->FindArea("public", startPos);
  size_t priv = this->FindArea("private", startPos);
  size_t protect = this->FindArea("protected", startPos);

  if(priv == std::string::npos)
    {
    priv = MAX_CHAR;
    }

  if(pub == std::string::npos)
    {
    pub = MAX_CHAR;
    }

  if(protect == std::string::npos)
    {
    protect = MAX_CHAR;
    }

  if(priv>pub || priv>protect)
     {
     if(priv>=pub && priv<=protect)
       {
       before = priv;
       after = protect;
       }
     else if(priv<=pub && priv>=protect)
       {
       before = priv;
       after = pub;
       }
     else
       {
       before = priv;
       size_t eoc = this->FindEndOfClass(priv);
       if(eoc != std::string::npos)
         {
         after = eoc;
         }
       else
         {
         after = priv; // end of class
         }
       }
     }
  else
    {
    before = priv;
    if(pub<protect)
      {
      after = pub;
      }
    else
      {
      after = protect;
      }
    }

  // If there is nothing after we point to the end of the class
  if(after == MAX_CHAR)
    {
    size_t classpos = this->GetClassPosition(startPos);
    if(classpos != std::string::npos)
      {
      size_t posBrace = m_BufferNoComment.find("{",classpos);
      if(posBrace != std::string::npos)
        {
        size_t end = this->FindClosingChar('{','}',posBrace,true);
        if(end != std::string::npos)
          {
          after = end;
          }
        }
      }
    }
}